

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O1

bool google::protobuf::internal::WireFormatLite::
     ReadRepeatedPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)5>
               (int param_1,uint32 tag,CodedInputStream *input,RepeatedField<int> *values)

{
  byte bVar1;
  int iVar2;
  ulong uVar3;
  uint32 uVar4;
  ulong uVar5;
  LogMessage *other;
  byte *pbVar6;
  int iVar7;
  ulong uVar8;
  bool bVar9;
  LogFinisher local_75;
  uint local_74;
  uint local_70;
  uint local_6c;
  LogMessage local_68;
  
  pbVar6 = input->buffer_;
  if (pbVar6 < input->buffer_end_) {
    bVar1 = *pbVar6;
    uVar8 = (ulong)bVar1;
    uVar4 = (uint32)bVar1;
    if (-1 < (char)bVar1) {
      input->buffer_ = pbVar6 + 1;
      bVar9 = true;
      goto LAB_0030aca5;
    }
  }
  else {
    uVar4 = 0;
  }
  uVar8 = io::CodedInputStream::ReadVarint32Fallback(input,uVar4);
  bVar9 = -1 < (long)uVar8;
LAB_0030aca5:
  if (bVar9) {
    if (values->current_size_ == values->total_size_) {
      RepeatedField<int>::Reserve(values,values->total_size_ + 1);
    }
    iVar7 = values->current_size_;
    values->current_size_ = iVar7 + 1;
    values->rep_->elements[iVar7] = (int)uVar8;
    bVar9 = true;
    iVar7 = values->total_size_ - values->current_size_;
    if (iVar7 != 0 && values->current_size_ <= values->total_size_) {
      local_70 = tag & 0xff | 0x80;
      local_74 = tag >> 7;
      iVar7 = iVar7 + 1;
      local_6c = tag;
      do {
        if (local_6c < 0x80) {
          pbVar6 = input->buffer_;
          if ((input->buffer_end_ <= pbVar6) || (*pbVar6 != local_6c)) break;
          pbVar6 = pbVar6 + 1;
        }
        else {
          if ((((0x3fff < local_6c) ||
               (pbVar6 = input->buffer_, *(int *)&input->buffer_end_ - (int)pbVar6 < 2)) ||
              (local_70 != *pbVar6)) || (local_74 != pbVar6[1])) break;
          pbVar6 = pbVar6 + 2;
        }
        input->buffer_ = pbVar6;
        if (pbVar6 < input->buffer_end_) {
          bVar1 = *pbVar6;
          uVar5 = (ulong)bVar1;
          uVar4 = (uint32)bVar1;
          if ((char)bVar1 < '\0') goto LAB_0030ad77;
          input->buffer_ = pbVar6 + 1;
          bVar9 = true;
        }
        else {
          uVar4 = 0;
LAB_0030ad77:
          uVar5 = io::CodedInputStream::ReadVarint32Fallback(input,uVar4);
          bVar9 = -1 < (long)uVar5;
        }
        uVar3 = uVar8;
        if (bVar9) {
          uVar3 = uVar5;
        }
        uVar8 = uVar3 & 0xffffffff;
        if (!bVar9) goto LAB_0030ae06;
        if (values->total_size_ <= values->current_size_) {
          LogMessage::LogMessage
                    (&local_68,LOGLEVEL_DFATAL,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                     ,0x456);
          other = LogMessage::operator<<
                            (&local_68,"CHECK failed: (current_size_) < (total_size_): ");
          LogFinisher::operator=(&local_75,other);
          LogMessage::~LogMessage(&local_68);
        }
        iVar2 = values->current_size_;
        values->current_size_ = iVar2 + 1;
        values->rep_->elements[iVar2] = (int)uVar3;
        iVar7 = iVar7 + -1;
      } while (1 < iVar7);
      bVar9 = true;
    }
  }
  else {
LAB_0030ae06:
    bVar9 = false;
  }
  return bVar9;
}

Assistant:

inline bool WireFormatLite::ReadRepeatedPrimitive(
    int,  // tag_size, unused.
    uint32 tag,
    io::CodedInputStream* input,
    RepeatedField<CType>* values) {
  CType value;
  if (!ReadPrimitive<CType, DeclaredType>(input, &value)) return false;
  values->Add(value);
  int elements_already_reserved = values->Capacity() - values->size();
  while (elements_already_reserved > 0 && input->ExpectTag(tag)) {
    if (!ReadPrimitive<CType, DeclaredType>(input, &value)) return false;
    values->AddAlreadyReserved(value);
    elements_already_reserved--;
  }
  return true;
}